

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinter.cpp
# Opt level: O3

void popupnewone_proc(Am_Object param_1)

{
  ushort uVar1;
  uint uVar2;
  Am_Object *pAVar3;
  Am_Wrapper *pAVar4;
  long *plVar5;
  ostream *poVar6;
  Am_Object new_pop;
  Am_Value v;
  Am_Object AStack_28;
  Am_Value local_20;
  Am_Object local_10;
  
  Am_Object::Create((char *)&local_20);
  uVar1 = Am_Object::Set((ushort)&local_20,100,(ulong)(window_count * 10 + 100));
  uVar1 = Am_Object::Set(uVar1,0x65,(ulong)(window_count * 10 + 100));
  pAVar3 = (Am_Object *)Am_Object::Set(uVar1,true,0);
  Am_Object::Am_Object(&AStack_28,pAVar3);
  Am_Object::~Am_Object((Am_Object *)&local_20);
  uVar2 = window_count + 3;
  if (-1 < window_count) {
    uVar2 = window_count;
  }
  uVar2 = (~uVar2 | 3) + window_count;
  if (uVar2 < 3) {
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)(&PTR_Am_Yellow_00113b50)[uVar2]);
    Am_Object::Set((ushort)&AStack_28,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  }
  window_count = window_count + 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Popping up window ",0x12);
  plVar5 = (long *)operator<<((ostream *)&std::cout,&AStack_28);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::ostream::flush();
  local_20.type = 0;
  local_20.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::Am_Object(&local_10,&AStack_28);
  Am_Pop_Up_Window_And_Wait((Am_Object_Data *)&local_10,&local_20,false);
  Am_Object::~Am_Object(&local_10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Popup ",6);
  poVar6 = (ostream *)operator<<((ostream *)&std::cout,&AStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," returned ",10);
  plVar5 = (long *)operator<<(poVar6,&local_20);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::ostream::flush();
  Am_Value::~Am_Value(&local_20);
  Am_Object::~Am_Object(&AStack_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, popupnewone, (Am_Object /*self*/))
{
  Am_Object new_pop = pop_up_window.Create()
                          .Set(Am_LEFT, 100 + window_count * 10)
                          .Set(Am_TOP, 100 + window_count * 10)
                          .Set(Am_VISIBLE, false);
  if (window_count % 4 == 1)
    new_pop.Set(Am_FILL_STYLE, Am_Yellow);
  else if (window_count % 4 == 2)
    new_pop.Set(Am_FILL_STYLE, Am_Blue);
  else if (window_count % 4 == 3)
    new_pop.Set(Am_FILL_STYLE, Am_Green);
  window_count++;
  cout << "Popping up window " << new_pop << endl << flush;
  Am_Value v;
  Am_Pop_Up_Window_And_Wait(new_pop, v, false);
  cout << "Popup " << new_pop << " returned " << v << endl << flush;
}